

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

bool dg::llvmdg::LLVMSlicer::shouldSliceInst(Value *val)

{
  uint uVar1;
  ret_type pIVar2;
  Value *in_RDI;
  Instruction *Inst;
  undefined1 local_1;
  
  pIVar2 = llvm::dyn_cast<llvm::Instruction,llvm::Value_const>(in_RDI);
  if (pIVar2 == (ret_type)0x0) {
    local_1 = true;
  }
  else {
    uVar1 = llvm::Instruction::getOpcode((Instruction *)0x1cef7e);
    if (uVar1 == 7) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static inline bool shouldSliceInst(const llvm::Value *val) {
        using namespace llvm;
        const Instruction *Inst = dyn_cast<Instruction>(val);
        if (!Inst)
            return true;

        switch (Inst->getOpcode()) {
        case Instruction::Unreachable:
#if 0
            case Instruction::Br:
            case Instruction::Switch:
            case Instruction::Ret:
#endif
            return false;
        default:
            return true;
        }
    }